

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::create_injectivity_constraints(Proof *this,int pattern_size,int target_size)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  ostream *poVar2;
  iterator iVar3;
  ulong uVar4;
  int local_220;
  int local_21c;
  long local_218;
  long n;
  key_type local_208 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream injectivity_constraint;
  ostream local_1a8 [376];
  
  local_220 = 0;
  local_21c = target_size;
  while( true ) {
    if (local_21c <= local_220) break;
    poVar2 = std::operator<<((ostream *)
                             &((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->field_0x50,"* injectivity on value ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_220);
    std::operator<<(poVar2,'\n');
    std::__cxx11::stringstream::stringstream((stringstream *)&injectivity_constraint);
    for (uVar4 = 0; (uint)(~(pattern_size >> 0x1f) & pattern_size) != uVar4; uVar4 = uVar4 + 1) {
      local_208[0].second = (long)local_220;
      local_208[0].first = uVar4;
      iVar3 = std::
              _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(((this->_imp)._M_t.
                        super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                        .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                      variable_mappings)._M_t,local_208);
      if (iVar3._M_node !=
          (_Base_ptr)
          ((long)&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  variable_mappings + 8U)) {
        poVar2 = std::operator<<(local_1a8,"-1 x");
        poVar2 = std::operator<<(poVar2,(string *)&iVar3._M_node[1]._M_left);
        std::operator<<(poVar2," ");
      }
    }
    std::operator<<(local_1a8,">= -1");
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    n = (_Var1._M_head_impl)->nb_constraints + 1;
    (_Var1._M_head_impl)->nb_constraints = n;
    local_218 = 0;
    if ((_Var1._M_head_impl)->recover_encoding == false) {
      local_218 = n;
    }
    std::__cxx11::stringbuf::str();
    std::
    tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<long_&,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_208,&n,&local_218,&local_1d8);
    std::
    _Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
    ::_M_emplace_unique<int&,std::tuple<long,long,std::__cxx11::string>>
              ((_Rb_tree<long,std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>,std::less<long>,std::allocator<std::pair<long_const,std::tuple<long,long,std::__cxx11::string>>>>
                *)&(_Var1._M_head_impl)->injectivity_constraints,&local_220,
               (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)&local_1d8);
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<((ostream *)&(_Var1._M_head_impl)->field_0x50,(string *)local_208);
    std::operator<<(poVar2," ;\n");
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::stringstream::~stringstream((stringstream *)&injectivity_constraint);
    local_220 = local_220 + 1;
  }
  return;
}

Assistant:

auto Proof::create_injectivity_constraints(int pattern_size, int target_size) -> void
{
    for (int v = 0; v < target_size; ++v) {
        _imp->model_stream << "* injectivity on value " << v << '\n';
        stringstream injectivity_constraint;

        for (int p = 0; p < pattern_size; ++p) {
            auto x = _imp->variable_mappings.find(pair{p, v});
            if (x != _imp->variable_mappings.end())
                injectivity_constraint << "-1 x" << x->second << " ";
        }
        injectivity_constraint << ">= -1";
        long n = ++_imp->nb_constraints;
        _imp->injectivity_constraints.emplace(v, tuple{n, _imp->recover_encoding ? 0 : n, injectivity_constraint.str()});
        _imp->model_stream << injectivity_constraint.str() << " ;\n";
    }
}